

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall
IlmThread_3_4::anon_unknown_5::DefaultThreadPoolProvider::addTask
          (DefaultThreadPoolProvider *this,Task *task)

{
  mutex *__mutex;
  Task *local_20;
  
  __mutex = &((this->_data).
              super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_taskMutex;
  local_20 = task;
  std::mutex::lock(__mutex);
  std::vector<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>::push_back
            (&((this->_data).
               super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_tasks,&local_20);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  Semaphore::post(&((this->_data).
                    super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_taskSemaphore);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::addTask (Task* task)
{
    // the thread pool will kill us and switch to a null provider
    // if the thread count is set to 0, so we can always
    // go ahead and lock and assume we have a thread to do the
    // processing
    {
        std::lock_guard<std::mutex> taskLock (_data->_taskMutex);

        //
        // Push the new task into the FIFO
        //
        _data->_tasks.push_back (task);
    }

    //
    // Signal that we have a new task to process
    //
    _data->_taskSemaphore.post ();
}